

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstr.cpp
# Opt level: O0

LPWSTR lstrcpyW(LPWSTR lpString1,LPCWSTR lpString2)

{
  LPWSTR lpStart;
  LPCWSTR lpString2_local;
  LPWSTR lpString1_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (lpString1 == (LPWSTR)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    lpString1_local = (LPWSTR)0x0;
  }
  else {
    lpStart = lpString2;
    lpString2_local = lpString1;
    if (lpString2 == (LPCWSTR)0x0) {
      if (!PAL_InitializeChakraCoreCalled) {
        abort();
      }
      if (!PAL_InitializeChakraCoreCalled) {
        abort();
      }
      lpString1_local = (LPWSTR)0x0;
    }
    else {
      while (*lpStart != L'\0') {
        *lpString2_local = *lpStart;
        lpStart = lpStart + 1;
        lpString2_local = lpString2_local + 1;
      }
      *lpString2_local = L'\0';
      lpString1_local = lpString1;
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
  }
  return lpString1_local;
}

Assistant:

LPWSTR
PALAPI
lstrcpyW(
	 OUT LPWSTR lpString1,
	 IN LPCWSTR lpString2)
{
    LPWSTR lpStart = lpString1;

    PERF_ENTRY(lstrcpyW);
    ENTRY("lstrcpyW (lpString1=%p, lpString2=%p (%S))\n",
          lpString1?lpString1:W16_NULLSTRING, lpString2?lpString2:W16_NULLSTRING, lpString2?lpString2:W16_NULLSTRING);

    if (lpString1 == NULL)
    {
        ERROR("invalid lpString1 argument\n");
        LOGEXIT("lstrcpyW returning LPWSTR NULL\n");
        PERF_EXIT(lstrcpyW);
        return NULL;
    }

    if (lpString2 == NULL)
    {
        ERROR("invalid lpString2 argument\n");
        LOGEXIT("lstrcpyW returning LPWSTR NULL\n");
        PERF_EXIT(lstrcpyW);
        return NULL;
    }

    /* copy source string to destination string */
    while(*lpString2)
    {
        *lpString1++ = *lpString2++;
    }

    /* add terminating null */
    *lpString1 = '\0';

    LOGEXIT("lstrcpyW returning LPWSTR %p (%S)\n", lpStart, lpStart);
    PERF_EXIT(lstrcpyW);
    return lpStart;
}